

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzv3dmesh.cpp
# Opt level: O1

void __thiscall
TPZV3DGraphMesh::TPZV3DGraphMesh
          (TPZV3DGraphMesh *this,TPZCompMesh *cmesh,int dimension,
          set<int,_std::less<int>,_std::allocator<int>_> *matids,
          TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *scalarnames,
          TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *vecnames)

{
  TPZGraphMesh::TPZGraphMesh
            (&this->super_TPZGraphMesh,&PTR_PTR_01995620,cmesh,dimension,matids,scalarnames,vecnames
            );
  (this->super_TPZGraphMesh).super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZV3DGraphMesh_01995580;
  this->fMesh = cmesh;
  (this->super_TPZGraphMesh).fStyle = EV3DStyle;
  this->fNumCases = 0;
  this->fInterval = 0;
  this->fLoadStep = 0;
  this->fTotScal = 0;
  this->fNumScal[0] = 0;
  this->fNumScal[1] = 0;
  this->fNumScal[2] = 0;
  this->fNumScal[3] = 0;
  this->fNumScal[4] = 0;
  this->fNumScal[5] = 0;
  return;
}

Assistant:

TPZV3DGraphMesh::TPZV3DGraphMesh(TPZCompMesh *cmesh, int dimension, const std::set<int> & matids, const TPZVec<std::string> &scalarnames,
                                 const TPZVec<std::string> &vecnames) : TPZGraphMesh(cmesh,dimension,matids,scalarnames,vecnames) {
	fMesh = cmesh;
	fStyle = EV3DStyle;
	fNumCases = 0;
	fTotScal = 0;
	fInterval = 0;
	fLoadStep = 0;
	for(int i=0; i<6; i++) fNumScal[i] = 0;
}